

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiteralExpressions.cpp
# Opt level: O2

Expression *
slang::ast::IntegerLiteral::fromSyntax(Compilation *comp,LiteralExpressionSyntax *syntax)

{
  Type *args_1;
  IntegerLiteral *pIVar1;
  bool local_41;
  SVInt val;
  SourceRange local_30;
  
  parsing::Token::intValue((Token *)&val);
  if ((val.super_SVIntStorage.bitWidth < 0x20) || ((int)(comp->options).languageVersion < 1)) {
    SVInt::resize((SVInt *)&local_30,(bitwidth_t)&val);
    SVInt::operator=(&val,(SVInt *)&local_30);
    SVInt::~SVInt((SVInt *)&local_30);
    val.super_SVIntStorage.signFlag = true;
    args_1 = comp->intType;
  }
  else {
    if (val.super_SVIntStorage.signFlag == false) {
      SVInt::resize((SVInt *)&local_30,(bitwidth_t)&val);
      SVInt::operator=(&val,(SVInt *)&local_30);
      SVInt::~SVInt((SVInt *)&local_30);
      val.super_SVIntStorage.signFlag = true;
    }
    args_1 = Compilation::getType
                       (comp,val.super_SVIntStorage.bitWidth,(bitmask<slang::ast::IntegralFlags>)0x1
                       );
  }
  local_41 = true;
  local_30 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
  pIVar1 = BumpAllocator::
           emplace<slang::ast::IntegerLiteral,slang::ast::Compilation&,slang::ast::Type_const&,slang::SVInt,bool,slang::SourceRange>
                     (&comp->super_BumpAllocator,comp,args_1,&val,&local_41,&local_30);
  SVInt::~SVInt(&val);
  return &pIVar1->super_Expression;
}

Assistant:

Expression& IntegerLiteral::fromSyntax(Compilation& comp, const LiteralExpressionSyntax& syntax) {
    SLANG_ASSERT(syntax.kind == SyntaxKind::IntegerLiteralExpression);

    const Type* type;
    SVInt val = syntax.literal.intValue();
    if (val.getBitWidth() < 32 || comp.languageVersion() < LanguageVersion::v1800_2023) {
        // In v2023 the rule changed to not truncate unsized literals.
        // Literals smaller than 32 bits are always sized up to 32.
        val = val.resize(32);
        val.setSigned(true);
        type = &comp.getIntType();
    }
    else {
        if (!val.isSigned()) {
            // Note the +1 here to account for the sign bit we're going to add.
            val = val.resize(val.getBitWidth() + 1);
            val.setSigned(true);
        }
        type = &comp.getType(val.getBitWidth(), IntegralFlags::Signed);
    }

    return *comp.emplace<IntegerLiteral>(comp, *type, std::move(val), true, syntax.sourceRange());
}